

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::Pubkey::CreateTweakMul(Pubkey *__return_storage_ptr__,Pubkey *this,ByteData256 *tweak)

{
  Pubkey *this_00;
  ByteData local_50;
  undefined1 local_38 [8];
  ByteData tweak_muled;
  ByteData256 *tweak_local;
  Pubkey *this_local;
  
  this_00 = __return_storage_ptr__;
  tweak_muled.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tweak;
  WallyUtil::MulTweakPubkey((ByteData *)local_38,&this->data_,tweak);
  ByteData::ByteData(&this_00->data_,&__return_storage_ptr__->data_);
  Pubkey(__return_storage_ptr__,&local_50);
  ByteData::~ByteData((ByteData *)0x47078b);
  ByteData::~ByteData((ByteData *)0x470794);
  return this_00;
}

Assistant:

Pubkey Pubkey::CreateTweakMul(const ByteData256 &tweak) const {
  ByteData tweak_muled = WallyUtil::MulTweakPubkey(data_, tweak);
  return Pubkey(tweak_muled);
}